

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp.cpp
# Opt level: O1

Factor * __thiscall libDAI::BP::belief(Factor *__return_storage_ptr__,BP *this,VarSet *ns)

{
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  VarSet *this_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  size_t I;
  Factor local_60;
  
  pp_Var1 = (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm;
  if ((long)(ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
            super__Vector_impl_data._M_start == 0x10) {
    (*pp_Var1[10])(__return_storage_ptr__,this);
  }
  else {
    iVar3 = (*pp_Var1[4])(this);
    lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x48))
                      ((long *)CONCAT44(extraout_var,iVar3));
    I = 0;
    if (lVar4 != 0) {
      do {
        iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this)
        ;
        this_00 = (VarSet *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x50))
                            ((long *)CONCAT44(extraout_var_00,iVar3),I);
        bVar2 = VarSet::includes(this_00,ns);
        if (bVar2) break;
        I = I + 1;
        iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this)
        ;
        uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x48))
                          ((long *)CONCAT44(extraout_var_01,iVar3));
      } while (I < uVar5);
    }
    beliefF(&local_60,this,I);
    TFactor<double>::marginal(__return_storage_ptr__,&local_60,ns,true);
    if (local_60._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60._vs._vars.
                      super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Factor BP::belief( const VarSet &ns ) const {
        if( ns.size() == 1 )
            return belief( *(ns.begin()) );
        else {
            size_t I;
            for( I = 0; I < grm().nrFactors(); I++ )
                if( grm().factor(I).vars() >> ns )
                    break;
            assert( I != grm().nrFactors() );
            return beliefF(I).marginal(ns);
        }
    }